

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> __thiscall
slang::parsing::Parser::parsePathTerminals(Parser *this)

{
  bool bVar1;
  NameSyntax *pNVar2;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  __extent_storage<18446744073709551615UL> extraout_RDX;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> sVar3;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> results;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_b0;
  undefined1 local_a0;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_98 [2];
  
  local_98[0].len = 0;
  local_98[0].cap = 4;
  local_98[0].data_ = (pointer)local_98[0].firstElement;
  while( true ) {
    pNVar2 = parseName(this,(bitmask<slang::parsing::detail::NameOptions>)0x40);
    local_b0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pNVar2;
    local_a0 = 1;
    SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
              (local_98,(TokenOrSyntax *)&local_b0._M_first);
    bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
    if (!bVar1) break;
    local_b0._M_first._M_storage =
         (_Uninitialized<slang::parsing::Token,_true>)ParserBase::consume(&this->super_ParserBase);
    local_a0 = 0;
    SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
              (local_98,(TokenOrSyntax *)&local_b0._M_first);
  }
  sVar3._M_ptr._0_4_ =
       SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                 (local_98,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
  sVar3._M_ptr._4_4_ = extraout_var;
  if (local_98[0].data_ != (pointer)local_98[0].firstElement) {
    operator_delete(local_98[0].data_);
  }
  sVar3._M_extent._M_extent_value = extraout_RDX._M_extent_value;
  return sVar3;
}

Assistant:

std::span<TokenOrSyntax> Parser::parsePathTerminals() {
    SmallVector<TokenOrSyntax, 4> results;
    while (true) {
        results.push_back(&parseName(NameOptions::NoClassScope));
        if (!peek(TokenKind::Comma))
            break;

        results.push_back(consume());
    }

    return results.copy(alloc);
}